

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

unsigned_long
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<signed_char,unsigned_long>
          (char input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  unsigned_long uVar1;
  undefined7 in_register_00000039;
  string local_40;
  
  if (input < '\0') {
    CastExceptionText<signed_char,unsigned_long>
              (&local_40,(duckdb *)(ulong)(uint)(int)input,(char)idx);
    uVar1 = HandleVectorCastError::Operation<unsigned_long>
                      (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    uVar1 = (unsigned_long)(int)CONCAT71(in_register_00000039,input);
  }
  return uVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}